

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O0

int archive_read_set_callback_data2(archive *_a,void *client_data,uint iindex)

{
  int iVar1;
  void *pvVar2;
  uint in_EDX;
  undefined8 in_RSI;
  archive *in_RDI;
  int magic_test;
  archive_read *a;
  char *in_stack_00000068;
  uint in_stack_00000070;
  uint in_stack_00000074;
  archive *in_stack_00000078;
  int local_4;
  
  iVar1 = __archive_check_magic
                    (in_stack_00000078,in_stack_00000074,in_stack_00000070,in_stack_00000068);
  if (iVar1 == -0x1e) {
    local_4 = -0x1e;
  }
  else {
    if (in_RDI[2].archive_format == 0) {
      pvVar2 = calloc(1,0x18);
      *(void **)&in_RDI[2].compression_code = pvVar2;
      if (*(long *)&in_RDI[2].compression_code == 0) {
        archive_set_error(in_RDI,0xc,"No memory.");
        return -0x1e;
      }
      in_RDI[2].archive_format = 1;
    }
    if (in_RDI[2].archive_format - 1U < in_EDX) {
      archive_set_error(in_RDI,0x16,"Invalid index specified.");
      local_4 = -0x1e;
    }
    else {
      *(undefined8 *)(*(long *)&in_RDI[2].compression_code + (ulong)in_EDX * 0x18 + 0x10) = in_RSI;
      *(undefined8 *)(*(long *)&in_RDI[2].compression_code + (ulong)in_EDX * 0x18) =
           0xffffffffffffffff;
      *(undefined8 *)(*(long *)&in_RDI[2].compression_code + (ulong)in_EDX * 0x18 + 8) =
           0xffffffffffffffff;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int
archive_read_set_callback_data2(struct archive *_a, void *client_data,
    unsigned int iindex)
{
	struct archive_read *a = (struct archive_read *)_a;
	archive_check_magic(_a, ARCHIVE_READ_MAGIC, ARCHIVE_STATE_NEW,
	    "archive_read_set_callback_data2");

	if (a->client.nodes == 0)
	{
		a->client.dataset = (struct archive_read_data_node *)
		    calloc(1, sizeof(*a->client.dataset));
		if (a->client.dataset == NULL)
		{
			archive_set_error(&a->archive, ENOMEM,
				"No memory.");
			return ARCHIVE_FATAL;
		}
		a->client.nodes = 1;
	}

	if (iindex > a->client.nodes - 1)
	{
		archive_set_error(&a->archive, EINVAL,
			"Invalid index specified.");
		return ARCHIVE_FATAL;
	}
	a->client.dataset[iindex].data = client_data;
	a->client.dataset[iindex].begin_position = -1;
	a->client.dataset[iindex].total_size = -1;
	return ARCHIVE_OK;
}